

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

RPCErrorCode RPCErrorFromPSBTError(PSBTError err)

{
  int in_EDI;
  long in_FS_OFFSET;
  undefined4 local_c;
  
  if (in_EDI == 1) {
    local_c = RPC_DESERIALIZATION_ERROR;
  }
  else if (in_EDI == 4) {
    local_c = RPC_INVALID_PARAMETER;
  }
  else {
    local_c = RPC_TRANSACTION_ERROR;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

RPCErrorCode RPCErrorFromPSBTError(PSBTError err)
{
    switch (err) {
        case PSBTError::UNSUPPORTED:
            return RPC_INVALID_PARAMETER;
        case PSBTError::SIGHASH_MISMATCH:
            return RPC_DESERIALIZATION_ERROR;
        default: break;
    }
    return RPC_TRANSACTION_ERROR;
}